

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Importer.cpp
# Opt level: O2

void __thiscall Assimp::glTF2Importer::ImportMeshes(glTF2Importer *this,Asset *r)

{
  uint *puVar1;
  float fVar2;
  pointer ppMVar3;
  Mesh *pMVar4;
  long *plVar5;
  Accessor *pAVar6;
  Tangent *pTVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  pointer pPVar11;
  aiMesh *paVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  aiVector3D *paVar14;
  Logger *pLVar15;
  float *pfVar16;
  aiAnimMesh **ppaVar17;
  aiAnimMesh *paVar18;
  undefined8 *puVar19;
  ulong *puVar20;
  aiFace *paVar21;
  ulong uVar22;
  int b;
  byte bVar23;
  size_t i_1;
  uint vertexId_2;
  int iVar24;
  ulong *puVar25;
  int iVar26;
  long lVar27;
  uint i;
  ulong *puVar28;
  ulong uVar29;
  long lVar30;
  size_t c;
  uint *puVar31;
  Tangent *pTVar32;
  aiVector3t<float> aVar33;
  aiFace *local_f8;
  ulong local_f0;
  aiMesh *aim;
  ulong *local_e0;
  uint k;
  Tangent *tangents;
  uint8_t *local_c8;
  Mesh *local_b0;
  ulong local_a8;
  ulong local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  uint local_8c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_88;
  glTF2Importer *local_80;
  aiVector3D *tangentDiff;
  Asset *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> meshes;
  
  meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  k = 0;
  meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_88 = &this->meshOffsets;
  uVar29 = 0;
  local_80 = this;
  local_58 = r;
  do {
    ppMVar3 = (local_58->meshes).mObjs.
              super__Vector_base<glTF2::Mesh_*,_std::allocator<glTF2::Mesh_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (((ulong)((long)(local_58->meshes).mObjs.
                       super__Vector_base<glTF2::Mesh_*,_std::allocator<glTF2::Mesh_*>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)ppMVar3) >> 3 & 0xffffffff) <=
        uVar29) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(local_88,&k);
      BaseImporter::CopyVector<aiMesh*>
                (&meshes,&local_80->mScene->mMeshes,&local_80->mScene->mNumMeshes);
      std::_Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>::~_Vector_base
                (&meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>);
      return;
    }
    pMVar4 = ppMVar3[uVar29];
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(local_88,&k);
    lVar27 = *(long *)&(pMVar4->primitives).
                       super__Vector_base<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>
                       ._M_impl.super__Vector_impl_data;
    pPVar11 = *(pointer *)
               ((long)&(pMVar4->primitives).
                       super__Vector_base<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>
                       ._M_impl + 8);
    k = k + (int)((ulong)((long)pPVar11 - lVar27) >> 8);
    local_98 = &(pMVar4->super_Object).name;
    local_50 = &(pMVar4->super_Object).id;
    uVar8 = 0;
    local_b0 = pMVar4;
    local_a8 = uVar29;
    while (local_a0 = (ulong)uVar8, local_a0 < (ulong)((long)pPVar11 - lVar27 >> 8)) {
      paVar12 = (aiMesh *)operator_new(0x520);
      aiMesh::aiMesh(paVar12);
      aim = paVar12;
      std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back(&meshes,&aim);
      paVar12 = aim;
      pbVar13 = local_98;
      if ((local_b0->super_Object).name._M_string_length == 0) {
        pbVar13 = local_50;
      }
      uVar29 = pbVar13->_M_string_length;
      if (uVar29 < 0x400) {
        (aim->mName).length = (ai_uint32)uVar29;
        memcpy((aim->mName).data,(pbVar13->_M_dataplus)._M_p,uVar29);
        (paVar12->mName).data[uVar29] = '\0';
      }
      paVar12 = aim;
      if (0x100 < (ulong)((long)*(pointer *)
                                 ((long)&(local_b0->primitives).
                                         super__Vector_base<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>
                                         ._M_impl + 8) -
                         *(long *)&(local_b0->primitives).
                                   super__Vector_base<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>
                                   ._M_impl.super__Vector_impl_data)) {
        uVar8 = (aim->mName).length;
        (aim->mName).data[uVar8] = '-';
        uVar8 = ASSIMP_itoa10((aim->mName).data + (ulong)uVar8 + 1,0x3ff - uVar8,(int32_t)local_a0);
        (paVar12->mName).length = uVar8 + (paVar12->mName).length + 1;
      }
      puVar31 = (uint *)(lVar27 + local_a0 * 0x100);
      if ((ulong)*puVar31 < 7) {
        aim->mPrimitiveTypes = aim->mPrimitiveTypes | *(uint *)(&DAT_0068254c + (ulong)*puVar31 * 4)
        ;
      }
      plVar5 = *(long **)(puVar31 + 2);
      if ((*(long **)(puVar31 + 4) != plVar5) && ((long *)*plVar5 != (long *)0x0)) {
        aim->mNumVertices =
             *(uint *)(*(long *)(*(long *)*plVar5 + (ulong)*(uint *)(plVar5 + 1) * 8) + 0x70);
        glTF2::Accessor::ExtractData<aiVector3t<float>>
                  (*(Accessor **)
                    (*(long *)**(undefined8 **)(puVar31 + 2) +
                    (ulong)*(uint *)(*(undefined8 **)(puVar31 + 2) + 1) * 8),&aim->mVertices);
      }
      plVar5 = *(long **)(puVar31 + 8);
      if ((*(long **)(puVar31 + 10) != plVar5) && ((long *)*plVar5 != (long *)0x0)) {
        glTF2::Accessor::ExtractData<aiVector3t<float>>
                  (*(Accessor **)(*(long *)*plVar5 + (ulong)*(uint *)(plVar5 + 1) * 8),
                   &aim->mNormals);
        plVar5 = *(long **)(puVar31 + 0xe);
        if ((*(long **)(puVar31 + 0x10) != plVar5) && ((long *)*plVar5 != (long *)0x0)) {
          tangents = (Tangent *)0x0;
          glTF2::Accessor::ExtractData<(anonymous_namespace)::Tangent>
                    (*(Accessor **)(*(long *)*plVar5 + (ulong)*(uint *)(plVar5 + 1) * 8),&tangents);
          paVar12 = aim;
          uVar8 = aim->mNumVertices;
          uVar29 = (ulong)uVar8 * 0xc;
          paVar14 = (aiVector3D *)operator_new__(uVar29);
          if (uVar8 != 0) {
            uVar29 = uVar29 - 0xc;
            memset(paVar14,0,(uVar29 - uVar29 % 0xc) + 0xc);
          }
          paVar12->mTangents = paVar14;
          uVar8 = paVar12->mNumVertices;
          uVar29 = (ulong)uVar8 * 0xc;
          paVar14 = (aiVector3D *)operator_new__(uVar29);
          if (uVar8 != 0) {
            uVar29 = uVar29 - 0xc;
            memset(paVar14,0,(uVar29 - uVar29 % 0xc) + 0xc);
          }
          pTVar7 = tangents;
          paVar12->mBitangents = paVar14;
          lVar27 = 0;
          pTVar32 = tangents;
          for (uVar29 = 0; uVar29 < paVar12->mNumVertices; uVar29 = uVar29 + 1) {
            paVar14 = paVar12->mTangents;
            *(float *)((long)&paVar14->z + lVar27) = (pTVar32->xyz).z;
            *(undefined8 *)((long)&paVar14->x + lVar27) = *(undefined8 *)&pTVar32->xyz;
            aVar33 = operator^((aiVector3t<float> *)((long)&paVar12->mNormals->x + lVar27),
                               &pTVar32->xyz);
            fVar2 = pTVar32->w;
            paVar14 = aim->mBitangents;
            *(ulong *)((long)&paVar14->x + lVar27) = CONCAT44(aVar33.y * fVar2,aVar33.x * fVar2);
            *(float *)((long)&paVar14->z + lVar27) = aVar33.z * fVar2;
            pTVar32 = pTVar32 + 1;
            lVar27 = lVar27 + 0xc;
            paVar12 = aim;
          }
          if (pTVar7 != (Tangent *)0x0) {
            operator_delete__(pTVar7);
          }
        }
      }
      lVar27 = 0x30;
      for (uVar29 = 0;
          (uVar29 < 8 &&
          (lVar30 = *(long *)(puVar31 + 0x1a),
          uVar29 < (ulong)(*(long *)(puVar31 + 0x1c) - lVar30 >> 4))); uVar29 = uVar29 + 1) {
        pAVar6 = *(Accessor **)
                  (**(long **)(lVar30 + -0x60 + lVar27 * 2) +
                  (ulong)*(uint *)(lVar30 + -0x58 + lVar27 * 2) * 8);
        if (pAVar6->count == (ulong)aim->mNumVertices) {
          glTF2::Accessor::ExtractData<aiColor4t<float>>
                    (pAVar6,(aiColor4t<float> **)((long)aim->mColors + lVar27 + -0x30));
        }
        else {
          pLVar15 = DefaultLogger::get();
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &tangentDiff,"Color stream size in mesh \"",local_98);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &tangents,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &tangentDiff,"\" does not match the vertex count");
          Logger::warn(pLVar15,(char *)tangents);
          std::__cxx11::string::~string((string *)&tangents);
          std::__cxx11::string::~string((string *)&tangentDiff);
        }
        lVar27 = lVar27 + 8;
      }
      for (uVar29 = 0;
          (paVar12 = aim, uVar29 < 8 &&
          (lVar27 = *(long *)(puVar31 + 0x14),
          uVar29 < (ulong)(*(long *)(puVar31 + 0x16) - lVar27 >> 4))); uVar29 = uVar29 + 1) {
        lVar30 = uVar29 * 0x10;
        pAVar6 = *(Accessor **)
                  (**(long **)(lVar27 + lVar30) + (ulong)*(uint *)(lVar27 + 8 + lVar30) * 8);
        if (pAVar6->count == (ulong)aim->mNumVertices) {
          glTF2::Accessor::ExtractData<aiVector3t<float>>(pAVar6,aim->mTextureCoords + uVar29);
          aim->mNumUVComponents[uVar29] =
               *(uint *)(&DAT_008debb8 +
                        (ulong)*(uint *)(*(long *)(**(long **)(*(long *)(puVar31 + 0x14) + lVar30) +
                                                  (ulong)*(uint *)(*(long *)(puVar31 + 0x14) + 8 +
                                                                  lVar30) * 8) + 0x78) * 0x10);
          pfVar16 = &aim->mTextureCoords[uVar29]->y;
          for (uVar22 = 0; uVar22 < aim->mNumVertices; uVar22 = uVar22 + 1) {
            *pfVar16 = 1.0 - *pfVar16;
            pfVar16 = pfVar16 + 3;
          }
        }
        else {
          pLVar15 = DefaultLogger::get();
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &tangentDiff,"Texcoord stream size in mesh \"",local_98);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &tangents,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &tangentDiff,"\" does not match the vertex count");
          Logger::warn(pLVar15,(char *)tangents);
          std::__cxx11::string::~string((string *)&tangents);
          std::__cxx11::string::~string((string *)&tangentDiff);
        }
      }
      if (*(long *)(puVar31 + 0x3c) - *(long *)(puVar31 + 0x3a) != 0) {
        uVar29 = (*(long *)(puVar31 + 0x3c) - *(long *)(puVar31 + 0x3a)) / 0x48;
        aim->mNumAnimMeshes = (uint)uVar29;
        ppaVar17 = (aiAnimMesh **)operator_new__((uVar29 & 0xffffffff) << 3);
        paVar12->mAnimMeshes = ppaVar17;
        for (uVar29 = 0;
            uVar29 < (ulong)((*(long *)(puVar31 + 0x3c) - *(long *)(puVar31 + 0x3a)) / 0x48);
            uVar29 = uVar29 + 1) {
          paVar18 = aiCreateAnimMesh(aim);
          aim->mAnimMeshes[uVar29] = paVar18;
          paVar18 = aim->mAnimMeshes[uVar29];
          lVar27 = *(long *)(puVar31 + 0x3a);
          lVar30 = uVar29 * 0x48;
          plVar5 = (long *)(lVar27 + lVar30);
          if (*(long *)(lVar27 + 8 + lVar30) != *(long *)(lVar27 + lVar30)) {
            tangents = (Tangent *)0x0;
            glTF2::Accessor::ExtractData<aiVector3t<float>>
                      (*(Accessor **)
                        (**(long **)*plVar5 + (ulong)*(uint *)((undefined8 *)*plVar5 + 1) * 8),
                       (aiVector3t<float> **)&tangents);
            lVar27 = 0;
            for (uVar22 = 0; uVar22 < aim->mNumVertices; uVar22 = uVar22 + 1) {
              aiVector3t<float>::operator+=
                        ((aiVector3t<float> *)((long)&paVar18->mVertices->x + lVar27),
                         (aiVector3t<float> *)((long)&(tangents->xyz).x + lVar27));
              lVar27 = lVar27 + 0xc;
            }
            if (tangents != (Tangent *)0x0) {
              operator_delete__(tangents);
            }
          }
          if (plVar5[4] != plVar5[3]) {
            tangents = (Tangent *)0x0;
            glTF2::Accessor::ExtractData<aiVector3t<float>>
                      (*(Accessor **)
                        (**(long **)plVar5[3] + (ulong)*(uint *)((undefined8 *)plVar5[3] + 1) * 8),
                       (aiVector3t<float> **)&tangents);
            lVar27 = 0;
            for (uVar22 = 0; uVar22 < aim->mNumVertices; uVar22 = uVar22 + 1) {
              aiVector3t<float>::operator+=
                        ((aiVector3t<float> *)((long)&paVar18->mNormals->x + lVar27),
                         (aiVector3t<float> *)((long)&(tangents->xyz).x + lVar27));
              lVar27 = lVar27 + 0xc;
            }
            if (tangents != (Tangent *)0x0) {
              operator_delete__(tangents);
            }
          }
          if (plVar5[7] != plVar5[6]) {
            tangents = (Tangent *)0x0;
            glTF2::Accessor::ExtractData<(anonymous_namespace)::Tangent>
                      (*(Accessor **)
                        (*(long *)**(undefined8 **)(puVar31 + 0xe) +
                        (ulong)*(uint *)(*(undefined8 **)(puVar31 + 0xe) + 1) * 8),&tangents);
            tangentDiff = (aiVector3D *)0x0;
            glTF2::Accessor::ExtractData<aiVector3t<float>>
                      (*(Accessor **)
                        (**(long **)plVar5[6] + (ulong)*(uint *)((undefined8 *)plVar5[6] + 1) * 8),
                       &tangentDiff);
            pTVar7 = tangents;
            lVar27 = 0;
            pTVar32 = tangents;
            for (uVar22 = 0; uVar22 < aim->mNumVertices; uVar22 = uVar22 + 1) {
              aiVector3t<float>::operator+=
                        (&pTVar32->xyz,(aiVector3t<float> *)((long)&tangentDiff->x + lVar27));
              paVar14 = paVar18->mTangents;
              *(undefined8 *)((long)&paVar14->x + lVar27) = *(undefined8 *)&pTVar32->xyz;
              *(float *)((long)&paVar14->z + lVar27) = (pTVar32->xyz).z;
              aVar33 = operator^((aiVector3t<float> *)((long)&paVar18->mNormals->x + lVar27),
                                 &pTVar32->xyz);
              fVar2 = pTVar32->w;
              paVar14 = paVar18->mBitangents;
              *(ulong *)((long)&paVar14->x + lVar27) = CONCAT44(aVar33.y * fVar2,aVar33.x * fVar2);
              *(float *)((long)&paVar14->z + lVar27) = aVar33.z * fVar2;
              lVar27 = lVar27 + 0xc;
              pTVar32 = pTVar32 + 1;
            }
            if (pTVar7 != (Tangent *)0x0) {
              operator_delete__(pTVar7);
            }
            if (tangentDiff != (aiVector3D *)0x0) {
              operator_delete__(tangentDiff);
            }
          }
          lVar27 = *(long *)&(local_b0->weights).super__Vector_base<float,_std::allocator<float>_>.
                             _M_impl.super__Vector_impl_data;
          if (uVar29 < (ulong)((long)*(pointer *)
                                      ((long)&(local_b0->weights).
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl + 8) - lVar27 >> 2)) {
            paVar18->mWeight = *(float *)(lVar27 + uVar29 * 4);
          }
        }
      }
      if (*(long **)(puVar31 + 0x32) == (long *)0x0) {
        uVar8 = *puVar31;
        if (6 < uVar8) goto switchD_005688aa_default;
        uVar9 = aim->mNumVertices;
        local_f0 = (ulong)uVar9;
        switch(uVar8) {
        case 0:
          puVar28 = (ulong *)operator_new__(local_f0 * 0x10 + 8);
          *puVar28 = local_f0;
          local_f8 = (aiFace *)(puVar28 + 1);
          if (local_f0 != 0) {
            paVar21 = local_f8;
            do {
              paVar21->mNumIndices = 0;
              paVar21->mIndices = (uint *)0x0;
              paVar21 = paVar21 + 1;
            } while (paVar21 != local_f8 + local_f0);
          }
          paVar21 = local_f8;
          for (uVar29 = 0; uVar8 = uVar9, local_f0 != uVar29; uVar29 = uVar29 + 1) {
            SetFace(paVar21,(int)uVar29);
            paVar21 = paVar21 + 1;
          }
          break;
        case 1:
          local_f0 = (ulong)(uVar9 >> 1);
          puVar28 = (ulong *)operator_new__(local_f0 * 0x10 + 8);
          *puVar28 = local_f0;
          local_f8 = (aiFace *)(puVar28 + 1);
          if (1 < uVar9) {
            paVar21 = local_f8;
            do {
              paVar21->mNumIndices = 0;
              paVar21->mIndices = (uint *)0x0;
              paVar21 = paVar21 + 1;
            } while (paVar21 != local_f8 + local_f0);
          }
          for (uVar10 = 0; uVar8 = uVar9 >> 1, uVar10 < uVar9; uVar10 = uVar10 + 2) {
            SetFace(local_f8 + (uVar10 >> 1),uVar10,uVar10 + 1);
          }
          break;
        default:
          uVar8 = uVar9 - (uVar8 == 3);
          uVar29 = (ulong)uVar8;
          puVar28 = (ulong *)operator_new__(uVar29 * 0x10 + 8);
          *puVar28 = uVar29;
          local_f8 = (aiFace *)(puVar28 + 1);
          if (uVar8 != 0) {
            paVar21 = local_f8;
            do {
              paVar21->mNumIndices = 0;
              paVar21->mIndices = (uint *)0x0;
              paVar21 = paVar21 + 1;
            } while (paVar21 != local_f8 + uVar29);
          }
          SetFace(local_f8,0,1);
          paVar21 = (aiFace *)(puVar28 + 3);
          local_e0 = puVar28;
          for (uVar22 = 2; uVar22 < local_f0; uVar22 = uVar22 + 1) {
            SetFace(paVar21,paVar21[-1].mIndices[1],(int)uVar22);
            paVar21 = paVar21 + 1;
          }
          local_f0 = uVar29;
          if (*puVar31 == 2) {
            SetFace(local_f8 + (uVar9 - 1),*(int *)(puVar28[(ulong)(uVar9 - 2) * 2 + 2] + 4),
                    *(int *)local_e0[2]);
          }
          break;
        case 4:
          local_f0 = local_f0 / 3;
          puVar28 = (ulong *)operator_new__(local_f0 * 0x10 + 8);
          *puVar28 = local_f0;
          local_f8 = (aiFace *)(puVar28 + 1);
          if (2 < uVar9) {
            paVar21 = local_f8;
            do {
              paVar21->mNumIndices = 0;
              paVar21->mIndices = (uint *)0x0;
              paVar21 = paVar21 + 1;
            } while (paVar21 != local_f8 + local_f0);
          }
          for (uVar10 = 0; uVar8 = (uint)local_f0, uVar10 < uVar9; uVar10 = uVar10 + 3) {
            SetFace(local_f8 + (ulong)uVar10 / 3,uVar10,uVar10 + 1,uVar10 + 2);
          }
          break;
        case 5:
          uVar8 = uVar9 - 2;
          local_f0 = (ulong)uVar8;
          puVar28 = (ulong *)operator_new__(local_f0 * 0x10 + 8);
          *puVar28 = local_f0;
          local_f8 = (aiFace *)(puVar28 + 1);
          if (uVar8 != 0) {
            paVar21 = local_f8;
            do {
              paVar21->mNumIndices = 0;
              paVar21->mIndices = (uint *)0x0;
              paVar21 = paVar21 + 1;
            } while (paVar21 != local_f8 + local_f0);
          }
          uVar29 = 0;
          paVar21 = local_f8;
          while (local_f0 != uVar29) {
            iVar24 = (int)uVar29;
            iVar26 = (int)(uVar29 + 1);
            b = iVar24;
            if ((uVar29 & 1) == 0) {
              b = iVar26;
              iVar26 = iVar24;
            }
            SetFace(paVar21,iVar26,b,iVar24 + 2);
            uVar29 = uVar29 + 1;
            paVar21 = paVar21 + 1;
          }
          break;
        case 6:
          uVar8 = uVar9 - 2;
          local_f0 = (ulong)uVar8;
          puVar28 = (ulong *)operator_new__(local_f0 * 0x10 + 8);
          *puVar28 = local_f0;
          local_f8 = (aiFace *)(puVar28 + 1);
          if (uVar8 != 0) {
            paVar21 = local_f8;
            do {
              paVar21->mNumIndices = 0;
              paVar21->mIndices = (uint *)0x0;
              paVar21 = paVar21 + 1;
            } while (paVar21 != local_f8 + local_f0);
          }
          SetFace(local_f8,0,1,2);
          paVar21 = (aiFace *)(puVar28 + 3);
          for (uVar29 = 1; uVar29 < local_f0; uVar29 = uVar29 + 1) {
            SetFace(paVar21,*(int *)puVar28[2],paVar21[-1].mIndices[2],(int)uVar29 + 2);
            paVar21 = paVar21 + 1;
          }
        }
      }
      else {
        pAVar6 = *(Accessor **)(**(long **)(puVar31 + 0x32) + (ulong)puVar31[0x34] * 8);
        puVar28 = (ulong *)pAVar6->count;
        glTF2::Accessor::Indexer::Indexer((Indexer *)&tangents,pAVar6);
        if (local_c8 == (uint8_t *)0x0) {
          __assert_fail("data.IsValid()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/glTF2/glTF2Importer.cpp"
                        ,0x207,"void Assimp::glTF2Importer::ImportMeshes(glTF2::Asset &)");
        }
        switch(*puVar31) {
        case 0:
          uVar29 = (long)puVar28 * 0x10 + 8;
          if ((ulong *)0xfffffffffffffff < puVar28) {
            uVar29 = 0xffffffffffffffff;
          }
          puVar20 = (ulong *)operator_new__(uVar29);
          *puVar20 = (ulong)puVar28;
          local_f8 = (aiFace *)(puVar20 + 1);
          if (puVar28 != (ulong *)0x0) {
            paVar21 = local_f8;
            do {
              paVar21->mNumIndices = 0;
              paVar21->mIndices = (uint *)0x0;
              paVar21 = paVar21 + 1;
            } while (paVar21 != local_f8 + (long)puVar28);
          }
          for (uVar8 = 0; puVar20 = puVar28, (ulong *)(ulong)uVar8 < puVar28; uVar8 = uVar8 + 1) {
            uVar9 = glTF2::Accessor::Indexer::GetValue<unsigned_int>((Indexer *)&tangents,uVar8);
            SetFace(local_f8 + (long)(ulong)uVar8,uVar9);
          }
          break;
        case 1:
          puVar20 = (ulong *)((ulong)puVar28 >> 1);
          puVar19 = (undefined8 *)
                    operator_new__(-(ulong)((ulong)puVar28 >> 0x3d != 0) | (long)puVar20 * 0x10 | 8)
          ;
          *puVar19 = puVar20;
          local_f8 = (aiFace *)(puVar19 + 1);
          if ((ulong *)0x1 < puVar28) {
            paVar21 = local_f8;
            do {
              paVar21->mNumIndices = 0;
              paVar21->mIndices = (uint *)0x0;
              paVar21 = paVar21 + 1;
            } while (paVar21 != local_f8 + (long)puVar20);
          }
          puVar25 = (ulong *)0x0;
          local_e0 = puVar20;
          while (iVar24 = (int)puVar25, puVar20 = local_e0, puVar25 < puVar28) {
            uVar8 = glTF2::Accessor::Indexer::GetValue<unsigned_int>((Indexer *)&tangents,iVar24);
            uVar9 = glTF2::Accessor::Indexer::GetValue<unsigned_int>
                              ((Indexer *)&tangents,iVar24 + 1);
            SetFace(local_f8 + ((ulong)puVar25 >> 1),uVar8,uVar9);
            puVar25 = (ulong *)(ulong)(iVar24 + 2);
          }
          break;
        case 2:
        case 3:
          puVar20 = (ulong *)((long)puVar28 - (ulong)(*puVar31 == 3));
          uVar29 = (long)puVar20 * 0x10 + 8;
          if ((ulong *)0xfffffffffffffff < puVar20) {
            uVar29 = 0xffffffffffffffff;
          }
          puVar19 = (undefined8 *)operator_new__(uVar29);
          *puVar19 = puVar20;
          local_f8 = (aiFace *)(puVar19 + 1);
          if (puVar20 != (ulong *)0x0) {
            paVar21 = local_f8;
            do {
              paVar21->mNumIndices = 0;
              paVar21->mIndices = (uint *)0x0;
              paVar21 = paVar21 + 1;
            } while (paVar21 != local_f8 + (long)puVar20);
          }
          local_e0 = puVar20;
          uVar8 = glTF2::Accessor::Indexer::GetValue<unsigned_int>((Indexer *)&tangents,0);
          uVar9 = glTF2::Accessor::Indexer::GetValue<unsigned_int>((Indexer *)&tangents,1);
          SetFace(local_f8,uVar8,uVar9);
          puVar20 = (ulong *)0x2;
          while (iVar24 = (int)puVar20, puVar20 < puVar28) {
            iVar26 = *(int *)(puVar19[(ulong)(iVar24 - 2) * 2 + 2] + 4);
            uVar8 = glTF2::Accessor::Indexer::GetValue<unsigned_int>((Indexer *)&tangents,iVar24);
            SetFace(local_f8 + (iVar24 - 1),iVar26,uVar8);
            puVar20 = (ulong *)(ulong)(iVar24 + 1);
          }
          puVar20 = local_e0;
          if (*puVar31 == 2) {
            SetFace(local_f8 + ((long)puVar28 - 1),local_f8[(long)puVar28 - 2].mIndices[1],
                    *(int *)puVar19[2]);
            puVar20 = local_e0;
          }
          break;
        case 4:
          puVar20 = (ulong *)((ulong)puVar28 / 3);
          uVar29 = (long)puVar20 * 0x10 + 8;
          if (2 < (uint)((ulong)puVar28 >> 0x3c)) {
            uVar29 = 0xffffffffffffffff;
          }
          puVar19 = (undefined8 *)operator_new__(uVar29);
          *puVar19 = puVar20;
          local_f8 = (aiFace *)(puVar19 + 1);
          if ((ulong *)0x2 < puVar28) {
            paVar21 = local_f8;
            do {
              paVar21->mNumIndices = 0;
              paVar21->mIndices = (uint *)0x0;
              paVar21 = paVar21 + 1;
            } while (paVar21 != local_f8 + (long)puVar20);
          }
          puVar25 = (ulong *)0x0;
          local_e0 = puVar20;
          while (iVar24 = (int)puVar25, puVar20 = local_e0, puVar25 < puVar28) {
            uVar8 = glTF2::Accessor::Indexer::GetValue<unsigned_int>((Indexer *)&tangents,iVar24);
            uVar9 = glTF2::Accessor::Indexer::GetValue<unsigned_int>
                              ((Indexer *)&tangents,iVar24 + 1);
            uVar10 = glTF2::Accessor::Indexer::GetValue<unsigned_int>
                               ((Indexer *)&tangents,iVar24 + 2);
            SetFace(local_f8 + (ulong)puVar25 / 3,uVar8,uVar9,uVar10);
            puVar25 = (ulong *)(ulong)(iVar24 + 3);
          }
          break;
        case 5:
          puVar28 = (ulong *)((long)puVar28 - 2);
          uVar29 = (long)puVar28 * 0x10 + 8;
          if ((ulong *)0xfffffffffffffff < puVar28) {
            uVar29 = 0xffffffffffffffff;
          }
          local_e0 = puVar28;
          puVar19 = (undefined8 *)operator_new__(uVar29);
          *puVar19 = local_e0;
          local_f8 = (aiFace *)(puVar19 + 1);
          if (local_e0 != (ulong *)0x0) {
            paVar21 = local_f8;
            do {
              paVar21->mNumIndices = 0;
              paVar21->mIndices = (uint *)0x0;
              paVar21 = paVar21 + 1;
            } while (paVar21 != local_f8 + (long)puVar28);
          }
          bVar23 = 1;
          puVar28 = (ulong *)0x0;
          while (uVar8 = (uint)puVar28, puVar20 = local_e0, puVar28 < local_e0) {
            local_8c = glTF2::Accessor::Indexer::GetValue<unsigned_int>
                                 ((Indexer *)&tangents,(uVar8 & 1) + uVar8);
            uVar9 = glTF2::Accessor::Indexer::GetValue<unsigned_int>
                              ((Indexer *)&tangents,(bVar23 & 1) + uVar8);
            uVar10 = glTF2::Accessor::Indexer::GetValue<unsigned_int>
                               ((Indexer *)&tangents,uVar8 + 2);
            bVar23 = bVar23 + 1;
            SetFace(local_f8 + (long)puVar28,local_8c,uVar9,uVar10);
            puVar28 = (ulong *)(ulong)(uVar8 + 1);
          }
          break;
        case 6:
          puVar28 = (ulong *)((long)puVar28 - 2);
          uVar29 = (long)puVar28 * 0x10 + 8;
          if ((ulong *)0xfffffffffffffff < puVar28) {
            uVar29 = 0xffffffffffffffff;
          }
          local_e0 = puVar28;
          puVar19 = (undefined8 *)operator_new__(uVar29);
          *puVar19 = local_e0;
          local_f8 = (aiFace *)(puVar19 + 1);
          if (local_e0 != (ulong *)0x0) {
            paVar21 = local_f8;
            do {
              paVar21->mNumIndices = 0;
              paVar21->mIndices = (uint *)0x0;
              paVar21 = paVar21 + 1;
            } while (paVar21 != local_f8 + (long)puVar28);
          }
          uVar8 = glTF2::Accessor::Indexer::GetValue<unsigned_int>((Indexer *)&tangents,0);
          uVar9 = glTF2::Accessor::Indexer::GetValue<unsigned_int>((Indexer *)&tangents,1);
          uVar10 = glTF2::Accessor::Indexer::GetValue<unsigned_int>((Indexer *)&tangents,2);
          SetFace(local_f8,uVar8,uVar9,uVar10);
          uVar8 = 0;
          while( true ) {
            uVar9 = uVar8 + 1;
            puVar20 = local_e0;
            if (local_e0 <= (ulong *)(ulong)uVar9) break;
            iVar24 = *(int *)puVar19[2];
            iVar26 = *(int *)(puVar19[(ulong)uVar8 * 2 + 2] + 8);
            uVar8 = glTF2::Accessor::Indexer::GetValue<unsigned_int>((Indexer *)&tangents,uVar8 + 3)
            ;
            SetFace(local_f8 + (long)(ulong)uVar9,iVar24,iVar26,uVar8);
            uVar8 = uVar9;
          }
          break;
        default:
          goto switchD_005688aa_default;
        }
        local_f0 = (ulong)puVar20 & 0xffffffff;
        uVar8 = (uint)puVar20;
      }
      aim->mFaces = local_f8;
      aim->mNumFaces = uVar8;
      for (uVar29 = 0; uVar29 != local_f0; uVar29 = uVar29 + 1) {
        uVar22 = 0;
        while (local_f8[uVar29].mNumIndices != uVar22) {
          puVar1 = local_f8[uVar29].mIndices + uVar22;
          uVar22 = uVar22 + 1;
          if (aim->mNumVertices <= *puVar1) {
            if (uVar29 < local_f0) {
              __assert_fail("CheckValidFacesIndices(faces, static_cast<unsigned>(nFaces), aim->mNumVertices)"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/glTF2/glTF2Importer.cpp"
                            ,0x29c,"void Assimp::glTF2Importer::ImportMeshes(glTF2::Asset &)");
            }
            goto switchD_005688aa_default;
          }
        }
      }
switchD_005688aa_default:
      if (*(long *)(puVar31 + 0x36) == 0) {
        uVar8 = local_80->mScene->mNumMaterials - 1;
      }
      else {
        uVar8 = puVar31[0x38];
      }
      aim->mMaterialIndex = uVar8;
      lVar27 = *(long *)&(local_b0->primitives).
                         super__Vector_base<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>
                         ._M_impl.super__Vector_impl_data;
      pPVar11 = *(pointer *)
                 ((long)&(local_b0->primitives).
                         super__Vector_base<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>
                         ._M_impl + 8);
      uVar8 = (int)local_a0 + 1;
    }
    uVar29 = local_a8 + 1;
  } while( true );
}

Assistant:

void glTF2Importer::ImportMeshes(glTF2::Asset& r)
{
    std::vector<aiMesh*> meshes;

    unsigned int k = 0;

    for (unsigned int m = 0; m < r.meshes.Size(); ++m) {
        Mesh& mesh = r.meshes[m];

        meshOffsets.push_back(k);
        k += unsigned(mesh.primitives.size());

        for (unsigned int p = 0; p < mesh.primitives.size(); ++p) {
            Mesh::Primitive& prim = mesh.primitives[p];

            aiMesh* aim = new aiMesh();
            meshes.push_back(aim);

            aim->mName = mesh.name.empty() ? mesh.id : mesh.name;

            if (mesh.primitives.size() > 1) {
                ai_uint32& len = aim->mName.length;
                aim->mName.data[len] = '-';
                len += 1 + ASSIMP_itoa10(aim->mName.data + len + 1, unsigned(MAXLEN - len - 1), p);
            }

            switch (prim.mode) {
                case PrimitiveMode_POINTS:
                    aim->mPrimitiveTypes |= aiPrimitiveType_POINT;
                    break;

                case PrimitiveMode_LINES:
                case PrimitiveMode_LINE_LOOP:
                case PrimitiveMode_LINE_STRIP:
                    aim->mPrimitiveTypes |= aiPrimitiveType_LINE;
                    break;

                case PrimitiveMode_TRIANGLES:
                case PrimitiveMode_TRIANGLE_STRIP:
                case PrimitiveMode_TRIANGLE_FAN:
                    aim->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
                    break;

            }

            Mesh::Primitive::Attributes& attr = prim.attributes;

            if (attr.position.size() > 0 && attr.position[0]) {
                aim->mNumVertices = static_cast<unsigned int>(attr.position[0]->count);
                attr.position[0]->ExtractData(aim->mVertices);
            }

            if (attr.normal.size() > 0 && attr.normal[0]) {
                attr.normal[0]->ExtractData(aim->mNormals);

                // only extract tangents if normals are present
                if (attr.tangent.size() > 0 && attr.tangent[0]) {
                    // generate bitangents from normals and tangents according to spec
                    Tangent *tangents = nullptr;

                    attr.tangent[0]->ExtractData(tangents);

                    aim->mTangents = new aiVector3D[aim->mNumVertices];
                    aim->mBitangents = new aiVector3D[aim->mNumVertices];

                    for (unsigned int i = 0; i < aim->mNumVertices; ++i) {
                        aim->mTangents[i] = tangents[i].xyz;
                        aim->mBitangents[i] = (aim->mNormals[i] ^ tangents[i].xyz) * tangents[i].w;
                    }

                    delete [] tangents;
                }
            }

            for (size_t c = 0; c < attr.color.size() && c < AI_MAX_NUMBER_OF_COLOR_SETS; ++c) {
                if (attr.color[c]->count != aim->mNumVertices) {
                    DefaultLogger::get()->warn("Color stream size in mesh \"" + mesh.name +
                        "\" does not match the vertex count");
                    continue;
                }
                attr.color[c]->ExtractData(aim->mColors[c]);
            }
            for (size_t tc = 0; tc < attr.texcoord.size() && tc < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++tc) {
                if (attr.texcoord[tc]->count != aim->mNumVertices) {
                    DefaultLogger::get()->warn("Texcoord stream size in mesh \"" + mesh.name +
                                               "\" does not match the vertex count");
                    continue;
                }

                attr.texcoord[tc]->ExtractData(aim->mTextureCoords[tc]);
                aim->mNumUVComponents[tc] = attr.texcoord[tc]->GetNumComponents();

                aiVector3D* values = aim->mTextureCoords[tc];
                for (unsigned int i = 0; i < aim->mNumVertices; ++i) {
                    values[i].y = 1 - values[i].y; // Flip Y coords
                }
            }

            std::vector<Mesh::Primitive::Target>& targets = prim.targets;
            if (targets.size() > 0) {
                aim->mNumAnimMeshes = (unsigned int)targets.size();
                aim->mAnimMeshes = new aiAnimMesh*[aim->mNumAnimMeshes];
                for (size_t i = 0; i < targets.size(); i++) {
                    aim->mAnimMeshes[i] = aiCreateAnimMesh(aim);
                    aiAnimMesh& aiAnimMesh = *(aim->mAnimMeshes[i]);
                    Mesh::Primitive::Target& target = targets[i];

                    if (target.position.size() > 0) {
                        aiVector3D *positionDiff = nullptr;
                        target.position[0]->ExtractData(positionDiff);
                        for(unsigned int vertexId = 0; vertexId < aim->mNumVertices; vertexId++) {
                            aiAnimMesh.mVertices[vertexId] += positionDiff[vertexId];
                        }
                        delete [] positionDiff;
                    }
                    if (target.normal.size() > 0) {
                        aiVector3D *normalDiff = nullptr;
                        target.normal[0]->ExtractData(normalDiff);
                        for(unsigned int vertexId = 0; vertexId < aim->mNumVertices; vertexId++) {
                            aiAnimMesh.mNormals[vertexId] += normalDiff[vertexId];
                        }
                        delete [] normalDiff;
                    }
                    if (target.tangent.size() > 0) {
                        Tangent *tangent = nullptr;
                        attr.tangent[0]->ExtractData(tangent);

                        aiVector3D *tangentDiff = nullptr;
                        target.tangent[0]->ExtractData(tangentDiff);

                        for (unsigned int vertexId = 0; vertexId < aim->mNumVertices; ++vertexId) {
                            tangent[vertexId].xyz += tangentDiff[vertexId];
                            aiAnimMesh.mTangents[vertexId] = tangent[vertexId].xyz;
                            aiAnimMesh.mBitangents[vertexId] = (aiAnimMesh.mNormals[vertexId] ^ tangent[vertexId].xyz) * tangent[vertexId].w;
                        }
                        delete [] tangent;
                        delete [] tangentDiff;
                    }
                    if (mesh.weights.size() > i) {
                        aiAnimMesh.mWeight = mesh.weights[i];
                    }
                }
            }


            aiFace* faces = 0;
            size_t nFaces = 0;

            if (prim.indices) {
                size_t count = prim.indices->count;

                Accessor::Indexer data = prim.indices->GetIndexer();
                ai_assert(data.IsValid());

                switch (prim.mode) {
                    case PrimitiveMode_POINTS: {
                        nFaces = count;
                        faces = new aiFace[nFaces];
                        for (unsigned int i = 0; i < count; ++i) {
                            SetFace(faces[i], data.GetUInt(i));
                        }
                        break;
                    }

                    case PrimitiveMode_LINES: {
                        nFaces = count / 2;
                        faces = new aiFace[nFaces];
                        for (unsigned int i = 0; i < count; i += 2) {
                            SetFace(faces[i / 2], data.GetUInt(i), data.GetUInt(i + 1));
                        }
                        break;
                    }

                    case PrimitiveMode_LINE_LOOP:
                    case PrimitiveMode_LINE_STRIP: {
                        nFaces = count - ((prim.mode == PrimitiveMode_LINE_STRIP) ? 1 : 0);
                        faces = new aiFace[nFaces];
                        SetFace(faces[0], data.GetUInt(0), data.GetUInt(1));
                        for (unsigned int i = 2; i < count; ++i) {
                            SetFace(faces[i - 1], faces[i - 2].mIndices[1], data.GetUInt(i));
                        }
                        if (prim.mode == PrimitiveMode_LINE_LOOP) { // close the loop
                            SetFace(faces[count - 1], faces[count - 2].mIndices[1], faces[0].mIndices[0]);
                        }
                        break;
                    }

                    case PrimitiveMode_TRIANGLES: {
                        nFaces = count / 3;
                        faces = new aiFace[nFaces];
                        for (unsigned int i = 0; i < count; i += 3) {
                            SetFace(faces[i / 3], data.GetUInt(i), data.GetUInt(i + 1), data.GetUInt(i + 2));
                        }
                        break;
                    }
                    case PrimitiveMode_TRIANGLE_STRIP: {
                        nFaces = count - 2;
                        faces = new aiFace[nFaces];
                        for (unsigned int i = 0; i < nFaces; ++i) {
                            //The ordering is to ensure that the triangles are all drawn with the same orientation
                            if ((i + 1) % 2 == 0)
                            {
                                //For even n, vertices n + 1, n, and n + 2 define triangle n
                                SetFace(faces[i], data.GetUInt(i + 1), data.GetUInt(i), data.GetUInt(i + 2));
                            }
                            else
                            {
                                //For odd n, vertices n, n+1, and n+2 define triangle n
                                SetFace(faces[i], data.GetUInt(i), data.GetUInt(i + 1), data.GetUInt(i + 2));
                            }
                        }
                        break;
                    }
                    case PrimitiveMode_TRIANGLE_FAN:
                        nFaces = count - 2;
                        faces = new aiFace[nFaces];
                        SetFace(faces[0], data.GetUInt(0), data.GetUInt(1), data.GetUInt(2));
                        for (unsigned int i = 1; i < nFaces; ++i) {
                            SetFace(faces[i], faces[0].mIndices[0], faces[i - 1].mIndices[2], data.GetUInt(i + 2));
                        }
                        break;
                }
            }
            else { // no indices provided so directly generate from counts

                // use the already determined count as it includes checks
                unsigned int count = aim->mNumVertices;

                switch (prim.mode) {
                case PrimitiveMode_POINTS: {
                    nFaces = count;
                    faces = new aiFace[nFaces];
                    for (unsigned int i = 0; i < count; ++i) {
                        SetFace(faces[i], i);
                    }
                    break;
                }

                case PrimitiveMode_LINES: {
                    nFaces = count / 2;
                    faces = new aiFace[nFaces];
                    for (unsigned int i = 0; i < count; i += 2) {
                        SetFace(faces[i / 2], i, i + 1);
                    }
                    break;
                }

                case PrimitiveMode_LINE_LOOP:
                case PrimitiveMode_LINE_STRIP: {
                    nFaces = count - ((prim.mode == PrimitiveMode_LINE_STRIP) ? 1 : 0);
                    faces = new aiFace[nFaces];
                    SetFace(faces[0], 0, 1);
                    for (unsigned int i = 2; i < count; ++i) {
                        SetFace(faces[i - 1], faces[i - 2].mIndices[1], i);
                    }
                    if (prim.mode == PrimitiveMode_LINE_LOOP) { // close the loop
                        SetFace(faces[count - 1], faces[count - 2].mIndices[1], faces[0].mIndices[0]);
                    }
                    break;
                }

                case PrimitiveMode_TRIANGLES: {
                    nFaces = count / 3;
                    faces = new aiFace[nFaces];
                    for (unsigned int i = 0; i < count; i += 3) {
                        SetFace(faces[i / 3], i, i + 1, i + 2);
                    }
                    break;
                }
                case PrimitiveMode_TRIANGLE_STRIP: {
                    nFaces = count - 2;
                    faces = new aiFace[nFaces];
                    for (unsigned int i = 0; i < nFaces; ++i) {
                        //The ordering is to ensure that the triangles are all drawn with the same orientation
                        if ((i+1) % 2 == 0)
                        {
                            //For even n, vertices n + 1, n, and n + 2 define triangle n
                            SetFace(faces[i], i+1, i, i+2);
                        }
                        else
                        {
                            //For odd n, vertices n, n+1, and n+2 define triangle n
                            SetFace(faces[i], i, i+1, i+2);
                        }
                    }
                    break;
                }
                case PrimitiveMode_TRIANGLE_FAN:
                    nFaces = count - 2;
                    faces = new aiFace[nFaces];
                    SetFace(faces[0], 0, 1, 2);
                    for (unsigned int i = 1; i < nFaces; ++i) {
                        SetFace(faces[i], faces[0].mIndices[0], faces[i - 1].mIndices[2], i + 2);
                    }
                    break;
                }
            }

            if (faces) {
                aim->mFaces = faces;
                aim->mNumFaces = static_cast<unsigned int>(nFaces);
                ai_assert(CheckValidFacesIndices(faces, static_cast<unsigned>(nFaces), aim->mNumVertices));
            }

            if (prim.material) {
                aim->mMaterialIndex = prim.material.GetIndex();
            }
            else {
                aim->mMaterialIndex = mScene->mNumMaterials - 1;
            }

        }
    }

    meshOffsets.push_back(k);

    CopyVector(meshes, mScene->mMeshes, mScene->mNumMeshes);
}